

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ioReadPlaMo.c
# Opt level: O2

Abc_Ntk_t * Mop_ManTest(char *pFileName,int fMerge,int fVerbose)

{
  word *pwVar1;
  Vec_Int_t *p;
  int i_00;
  Mop_Man_t *p_00;
  word *pwVar2;
  Abc_Ntk_t *pAVar3;
  ulong uVar4;
  ulong uVar5;
  int nSizeNew;
  int i;
  int i_01;
  
  p_00 = Mop_ManRead(pFileName);
  if (p_00 == (Mop_Man_t *)0x0) {
    pAVar3 = (Abc_Ntk_t *)0x0;
  }
  else {
    p = p_00->vCubes;
    nSizeNew = 0;
    for (i_01 = 0; i_01 < p->nSize; i_01 = i_01 + 1) {
      i_00 = Vec_IntEntry(p,i_01);
      pwVar2 = Mop_ManCubeOut(p_00,i_00);
      uVar4 = (ulong)(uint)p_00->nWordsOut;
      if (p_00->nWordsOut < 1) {
        uVar4 = 0;
      }
      uVar5 = 0;
      do {
        if (uVar4 == uVar5) goto LAB_002e1335;
        pwVar1 = pwVar2 + uVar5;
        uVar5 = uVar5 + 1;
      } while (*pwVar1 == 0);
      Vec_IntWriteEntry(p,nSizeNew,i_00);
      nSizeNew = nSizeNew + 1;
LAB_002e1335:
    }
    Vec_IntShrink(p,nSizeNew);
    if (fMerge == 0) {
      Mop_ManReduce(p_00);
    }
    else {
      Mop_ManReduce2(p_00);
    }
    pAVar3 = Mop_ManDerive(p_00,pFileName);
    Mop_ManStop(p_00);
  }
  return pAVar3;
}

Assistant:

Abc_Ntk_t * Mop_ManTest( char * pFileName, int fMerge, int fVerbose )
{
    Abc_Ntk_t * pNtk = NULL;
    Mop_Man_t * p = Mop_ManRead( pFileName );
    if ( p == NULL )
        return NULL;
    Mop_ManRemoveEmpty( p );
    //Mop_ManPrint( p );
    if ( fMerge )
        Mop_ManReduce2( p );
    else
        Mop_ManReduce( p );
    //Mop_ManPrint( p );
    pNtk = Mop_ManDerive( p, pFileName );
    Mop_ManStop( p );
    return pNtk;
}